

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::FileOptions::ByteSizeLong(FileOptions *this)

{
  size_type sVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined8 in_RSI;
  Rep *pRVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  
  sVar4 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  uVar9 = (undefined4)in_RSI;
  lVar12 = (long)(this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  pRVar10 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar10 != (Rep *)0x0) {
    pRVar10 = (Rep *)pRVar10->elements;
  }
  sVar4 = sVar4 + lVar12 * 2;
  if (lVar12 != 0) {
    lVar11 = 0;
    do {
      sVar5 = UninterpretedOption::ByteSizeLong
                        (*(UninterpretedOption **)((long)pRVar10->elements + lVar11 + -8));
      uVar9 = (undefined4)in_RSI;
      uVar3 = (uint)sVar5 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      lVar11 = lVar11 + 8;
    } while (lVar12 * 8 != lVar11);
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar3 != '\0') {
    if ((uVar3 & 1) != 0) {
      sVar1 = ((this->java_package_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 2) != 0) {
      sVar1 = ((this->java_outer_classname_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 4) != 0) {
      sVar1 = ((this->go_package_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 8) != 0) {
      sVar1 = ((this->objc_class_prefix_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 0x10) != 0) {
      sVar1 = ((this->csharp_namespace_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 0x20) != 0) {
      sVar1 = ((this->swift_prefix_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 & 0x40) != 0) {
      sVar1 = ((this->php_class_prefix_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((char)uVar3 < '\0') {
      sVar1 = ((this->php_namespace_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
  }
  if ((uVar3 & 0xff00) != 0) {
    if ((uVar3 >> 8 & 1) != 0) {
      sVar1 = ((this->php_metadata_namespace_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar3 >> 9 & 1) != 0) {
      sVar1 = ((this->ruby_package_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar1 | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar4 = sVar4 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    sVar5 = sVar4 + 3;
    if ((uVar3 >> 0xb & 1) == 0) {
      sVar5 = sVar4;
    }
    sVar5 = sVar5 + (uVar3 >> 9 & 2);
    auVar13._0_4_ = -(uint)((uVar3 & 0x8000) == 0);
    auVar13._4_4_ = -(uint)((uVar3 & 0x4000) == 0);
    auVar13._8_4_ = -(uint)((uVar3 & 0x2000) == 0);
    auVar13._12_4_ = -(uint)((uVar3 & 0x1000) == 0);
    uVar6 = movmskps(uVar9,auVar13);
    sVar4 = sVar5 + 3;
    if ((uVar6 & 8) != 0) {
      sVar4 = sVar5;
    }
    sVar5 = sVar4 + 3;
    if ((uVar6 & 4) != 0) {
      sVar5 = sVar4;
    }
    sVar7 = sVar5 + 3;
    if ((uVar6 & 2) != 0) {
      sVar7 = sVar5;
    }
    sVar4 = sVar7 + 3;
    if ((uVar6 & 1) != 0) {
      sVar4 = sVar7;
    }
  }
  if ((uVar3 & 0xf0000) != 0) {
    sVar5 = sVar4 + 3;
    if ((uVar3 >> 0x10 & 1) == 0) {
      sVar5 = sVar4;
    }
    sVar7 = sVar5 + 3;
    if ((uVar3 >> 0x11 & 1) == 0) {
      sVar7 = sVar5;
    }
    if ((uVar3 >> 0x12 & 1) != 0) {
      if (this->optimize_for_ < 0) {
        uVar8 = 0xb;
      }
      else {
        uVar6 = this->optimize_for_ | 1;
        iVar2 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar8 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
      }
      sVar7 = sVar7 + uVar8;
    }
    sVar4 = sVar7 + 3;
    if ((uVar3 >> 0x13 & 1) == 0) {
      sVar4 = sVar7;
    }
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar4;
    return sVar4;
  }
  sVar4 = internal::ComputeUnknownFieldsSize
                    (&(this->super_Message).super_MessageLite._internal_metadata_,sVar4,
                     &this->_cached_size_);
  return sVar4;
}

Assistant:

size_t FileOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2UL * this->_internal_uninterpreted_option_size();
  for (const auto& msg : this->uninterpreted_option_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    // optional string java_package = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_java_package());
    }

    // optional string java_outer_classname = 8;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_java_outer_classname());
    }

    // optional string go_package = 11;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_go_package());
    }

    // optional string objc_class_prefix = 36;
    if (cached_has_bits & 0x00000008u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_objc_class_prefix());
    }

    // optional string csharp_namespace = 37;
    if (cached_has_bits & 0x00000010u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_csharp_namespace());
    }

    // optional string swift_prefix = 39;
    if (cached_has_bits & 0x00000020u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_swift_prefix());
    }

    // optional string php_class_prefix = 40;
    if (cached_has_bits & 0x00000040u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_php_class_prefix());
    }

    // optional string php_namespace = 41;
    if (cached_has_bits & 0x00000080u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_php_namespace());
    }

  }
  if (cached_has_bits & 0x0000ff00u) {
    // optional string php_metadata_namespace = 44;
    if (cached_has_bits & 0x00000100u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_php_metadata_namespace());
    }

    // optional string ruby_package = 45;
    if (cached_has_bits & 0x00000200u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_ruby_package());
    }

    // optional bool java_multiple_files = 10 [default = false];
    if (cached_has_bits & 0x00000400u) {
      total_size += 1 + 1;
    }

    // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
    if (cached_has_bits & 0x00000800u) {
      total_size += 2 + 1;
    }

    // optional bool java_string_check_utf8 = 27 [default = false];
    if (cached_has_bits & 0x00001000u) {
      total_size += 2 + 1;
    }

    // optional bool cc_generic_services = 16 [default = false];
    if (cached_has_bits & 0x00002000u) {
      total_size += 2 + 1;
    }

    // optional bool java_generic_services = 17 [default = false];
    if (cached_has_bits & 0x00004000u) {
      total_size += 2 + 1;
    }

    // optional bool py_generic_services = 18 [default = false];
    if (cached_has_bits & 0x00008000u) {
      total_size += 2 + 1;
    }

  }
  if (cached_has_bits & 0x000f0000u) {
    // optional bool php_generic_services = 42 [default = false];
    if (cached_has_bits & 0x00010000u) {
      total_size += 2 + 1;
    }

    // optional bool deprecated = 23 [default = false];
    if (cached_has_bits & 0x00020000u) {
      total_size += 2 + 1;
    }

    // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
    if (cached_has_bits & 0x00040000u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_optimize_for());
    }

    // optional bool cc_enable_arenas = 31 [default = true];
    if (cached_has_bits & 0x00080000u) {
      total_size += 2 + 1;
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}